

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixOrtho(float *result,float left,float right,float bottom,float top,float z_near,
                    float z_far)

{
  float in_XMM0_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float local_48 [6];
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  undefined4 local_1c;
  undefined8 local_18;
  float local_10;
  undefined4 local_c;
  
  if (result != (float *)0x0) {
    local_48[0] = 2.0 / (right - left);
    local_48[5] = 2.0 / (top - bottom);
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    local_48[4] = 0.0;
    local_20 = -2.0 / (z_far - z_near);
    local_30 = 0;
    uStack_28 = 0;
    local_1c = 0;
    auVar1._0_8_ = CONCAT44(bottom + top,left + right) ^ 0x8000000080000000;
    auVar1._8_4_ = -(in_XMM0_Db + in_XMM1_Db);
    auVar1._12_4_ = -(in_XMM2_Db + in_XMM3_Db);
    auVar2._4_4_ = top - bottom;
    auVar2._0_4_ = right - left;
    auVar2._8_4_ = in_XMM1_Db - in_XMM0_Db;
    auVar2._12_4_ = in_XMM3_Db - in_XMM2_Db;
    auVar2 = divps(auVar1,auVar2);
    local_18 = auVar2._0_8_;
    local_10 = -(z_near + z_far) / (z_far - z_near);
    local_c = 0x3f800000;
    GPU_MultiplyAndAssign(result,local_48);
  }
  return;
}

Assistant:

void GPU_MatrixOrtho(float* result, float left, float right, float bottom, float top, float z_near, float z_far)
{
    if(result == NULL)
		return;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				2/(right - left), 0,  0, -(right + left)/(right - left),
				0, 2/(top - bottom), 0, -(top + bottom)/(top - bottom),
				0, 0, -2/(z_far - z_near), -(z_far + z_near)/(z_far - z_near),
				0, 0, 0, 1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				2 / (right - left), 0, 0, 0,
				0, 2 / (top - bottom), 0, 0,
				0, 0, -2 / (z_far - z_near), 0,
				-(right + left) / (right - left), -(top + bottom) / (top - bottom), -(z_far + z_near) / (z_far - z_near), 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}